

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify_cfg.cpp
# Opt level: O1

bool __thiscall mocker::RewriteBranches::operator()(RewriteBranches *this)

{
  FunctionModule *pFVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _List_node_base *p_Var3;
  ulong uVar4;
  Jump *pJVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  BasicBlock *bb;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _List_node_base *p_Var9;
  shared_ptr<mocker::ir::Label> target;
  shared_ptr<mocker::ir::IntLiteral> condition;
  undefined1 local_69;
  Jump *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  shared_ptr<mocker::ir::Label> local_58;
  shared_ptr<mocker::ir::Addr> local_48;
  _List_node_base *local_38;
  
  pFVar1 = (this->super_FuncPass).func;
  p_Var7 = (pFVar1->bbs).
           super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  local_38 = (_List_node_base *)&pFVar1->bbs;
  if (p_Var7 != local_38) {
    do {
      for (p_Var9 = p_Var7[1]._M_prev; p_Var9 != (_List_node_base *)&p_Var7[1]._M_prev;
          p_Var9 = p_Var9->_M_next) {
        p_Var8 = p_Var9[1]._M_next;
        if (*(int *)&p_Var8->_M_prev == 0xb) {
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var9[1]._M_prev;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
        }
        else {
          p_Var8 = (_List_node_base *)0x0;
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if (p_Var8 != (_List_node_base *)0x0) {
          ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>
                    (&local_48,(IntLiteral *)((long)(p_Var8 + 1) + 8));
          if (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            this->cnt = this->cnt + 1;
            uVar4 = (ulong)(local_48.
                            super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            [1]._vptr_Addr == (_func_int **)0x0);
            local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(element_type **)((long)(p_Var8 + uVar4 + 2) + 8);
            local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8[uVar4 + 3]._M_next;
            if (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_68 = (Jump *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::ir::Jump,std::allocator<mocker::ir::Jump>,std::shared_ptr<mocker::ir::Label>&>
                      (&_Stack_60,&local_68,(allocator<mocker::ir::Jump> *)&local_69,&local_58);
            _Var6._M_pi = _Stack_60._M_pi;
            pJVar5 = local_68;
            local_68 = (Jump *)0x0;
            _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var9[1]._M_prev;
            p_Var9[1]._M_next = (_List_node_base *)pJVar5;
            p_Var9[1]._M_prev = (_List_node_base *)_Var6._M_pi;
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            }
            if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
            }
            uVar4 = (ulong)(local_48.
                            super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            [1]._vptr_Addr != (_func_int **)0x0);
            p_Var3 = *(_List_node_base **)((long)(p_Var8 + uVar4 + 2) + 8);
            p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8[uVar4 + 3]._M_next;
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              }
            }
            bb = ir::FunctionModule::getMutableBasicBlock
                           ((this->super_FuncPass).func,(size_t)p_Var3->_M_prev);
            deletePhiOptionInBB(bb,(size_t)p_Var7[1]._M_next);
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            }
            if (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          if (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      p_Var7 = p_Var7->_M_next;
    } while (p_Var7 != local_38);
  }
  return this->cnt != 0;
}

Assistant:

bool RewriteBranches::operator()() {
  for (auto &bb : func.getMutableBBs()) {
    for (auto &inst : bb.getMutableInsts()) {
      auto br = ir::dyc<ir::Branch>(inst);
      if (!br)
        continue;
      auto condition = ir::dyc<ir::IntLiteral>(br->getCondition());
      if (!condition)
        continue;
      ++cnt;
      auto target = condition->getVal() ? br->getThen() : br->getElse();
      inst = std::make_shared<ir::Jump>(target);
      auto notTarget = condition->getVal() ? br->getElse() : br->getThen();
      deletePhiOptionInBB(func.getMutableBasicBlock(notTarget->getID()),
                          bb.getLabelID());
    }
  }

  return cnt != 0;
}